

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O2

void __thiscall QGraphicsGridLayout::setGeometry(QGraphicsGridLayout *this,QRectF *rect)

{
  QGraphicsGridLayoutPrivate *this_00;
  double dVar1;
  LayoutDirection LVar2;
  long in_FS_OFFSET;
  undefined4 uVar3;
  undefined4 uVar4;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  double dStack_50;
  double local_48;
  double dStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsGridLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QGraphicsLayoutItem::setGeometry((QGraphicsLayoutItem *)this,rect);
  local_48 = -NAN;
  dStack_40 = -NAN;
  local_58 = (undefined1  [8])0xffffffffffffffff;
  dStack_50 = -NAN;
  QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)this);
  local_60 = -NAN;
  local_68 = -NAN;
  local_70 = -NAN;
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])
            (this,&local_60,&local_68,&local_70);
  LVar2 = QGraphicsLayoutPrivate::visualDirection((QGraphicsLayoutPrivate *)this_00);
  QGridLayoutEngine::setVisualDirection((LayoutDirection)&this_00->engine);
  dVar1 = local_60;
  uVar3 = SUB84(local_70,0);
  uVar4 = (undefined4)((ulong)local_70 >> 0x20);
  if (LVar2 == RightToLeft) {
    local_60 = local_70;
    local_70 = dVar1;
  }
  else {
    uVar3 = SUB84(local_60,0);
    uVar4 = (undefined4)((ulong)local_60 >> 0x20);
  }
  local_58 = (undefined1  [8])((double)local_58 + (double)CONCAT44(uVar4,uVar3));
  dStack_50 = dStack_50 + local_68;
  local_48 = (-local_70 - (double)CONCAT44(uVar4,uVar3)) + local_48;
  dStack_40 = (NAN - local_68) + dStack_40;
  QGraphicsGridLayoutPrivate::styleInfo(this_00);
  QGridLayoutEngine::setGeometries((QRectF *)&this_00->engine,(QAbstractLayoutStyleInfo *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::setGeometry(const QRectF &rect)
{
    Q_D(QGraphicsGridLayout);
    QGraphicsLayout::setGeometry(rect);
    QRectF effectiveRect = geometry();
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    Qt::LayoutDirection visualDir = d->visualDirection();
    d->engine.setVisualDirection(visualDir);
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);
    effectiveRect.adjust(+left, +top, -right, -bottom);
    d->engine.setGeometries(effectiveRect, d->styleInfo());
#ifdef QGRIDLAYOUTENGINE_DEBUG
    if (qt_graphicsLayoutDebug()) {
        static int counter = 0;
        qDebug("==== BEGIN DUMP OF QGraphicsGridLayout (%d)====", counter++);
        d->dump(1);
        qDebug("==== END DUMP OF QGraphicsGridLayout ====");
    }
#endif
}